

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

interval_t __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,duckdb::interval_t,duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
          *accessor)

{
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>
  __comp;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>
  __comp_00;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>
  __comp_01;
  QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
  *in_RCX;
  interval_t *hi_00;
  interval_t *in_RDI;
  RESULT_TYPE RVar1;
  interval_t iVar2;
  interval_t hi;
  interval_t lo;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>
  comp;
  unsigned_long *in_stack_ffffffffffffff60;
  unsigned_long *in_stack_ffffffffffffff68;
  unsigned_long *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff80;
  QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
  *pQVar3;
  undefined8 in_stack_ffffffffffffff88;
  Vector *pVVar4;
  undefined8 in_stack_ffffffffffffff90;
  undefined1 local_48 [56];
  interval_t local_10;
  
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>
  ::QuantileCompare((QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>
                     *)local_48,in_RCX,(bool)(*(byte *)&in_RDI->months & 1));
  if ((QuantileIndirect<duckdb::timestamp_t> *)in_RDI[1].micros ==
      *(QuantileIndirect<duckdb::timestamp_t> **)(in_RDI + 1)) {
    __comp.accessor_r =
         (QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
          *)in_stack_ffffffffffffff88;
    __comp.accessor_l =
         (QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
          *)in_stack_ffffffffffffff80;
    __comp._16_8_ = in_stack_ffffffffffffff90;
    std::
    nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,__comp)
    ;
    QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
    ::operator()((QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
                  *)in_RDI,(idx_t *)local_48._16_8_);
    local_10 = CastInterpolation::Cast<duckdb::interval_t,duckdb::interval_t>
                         (in_RDI,(Vector *)local_48._16_8_);
  }
  else {
    __comp_00.accessor_r =
         (QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
          *)local_48._16_8_;
    __comp_00.accessor_l =
         (QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
          *)local_48._8_8_;
    __comp_00._16_8_ = in_stack_ffffffffffffff90;
    pQVar3 = (QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
              *)local_48._8_8_;
    pVVar4 = (Vector *)local_48._16_8_;
    std::
    nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               __comp_00);
    __comp_01.accessor_r =
         (QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
          *)pVVar4;
    __comp_01.accessor_l = pQVar3;
    __comp_01._16_8_ = in_stack_ffffffffffffff90;
    std::
    nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>>
              (in_stack_ffffffffffffff70,(unsigned_long *)local_48._16_8_,
               (unsigned_long *)local_48._8_8_,__comp_01);
    QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
    ::operator()((QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
                  *)in_RDI,(idx_t *)local_48._16_8_);
    CastInterpolation::Cast<duckdb::interval_t,duckdb::interval_t>(in_RDI,(Vector *)local_48._16_8_)
    ;
    RVar1 = QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
            ::operator()((QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
                          *)in_RDI,(idx_t *)local_48._16_8_);
    hi_00 = (interval_t *)RVar1.micros;
    iVar2 = CastInterpolation::Cast<duckdb::interval_t,duckdb::interval_t>
                      (in_RDI,(Vector *)local_48._16_8_);
    local_10 = CastInterpolation::Interpolate<duckdb::interval_t>
                         ((interval_t *)iVar2.micros,iVar2._0_8_,hi_00);
  }
  return local_10;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}